

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_MultipleOneofs_Test::TestBody
          (ParseMessageTest_MultipleOneofs_Test *this)

{
  ParserTest::ExpectParsesTo
            (&this->super_ParseMessageTest,
             "message TestMessage {\n  oneof foo {\n    int32 a = 1;\n    string b = 2;\n  }\n  oneof bar {\n    int32 c = 3;\n    string d = 4;\n  }\n}\n"
             ,
             "message_type {  name: \"TestMessage\"  field { name:\"a\" label:LABEL_OPTIONAL type:TYPE_INT32 number:1           oneof_index:0 }  field { name:\"b\" label:LABEL_OPTIONAL type:TYPE_STRING number:2           oneof_index:0 }  field { name:\"c\" label:LABEL_OPTIONAL type:TYPE_INT32 number:3           oneof_index:1 }  field { name:\"d\" label:LABEL_OPTIONAL type:TYPE_STRING number:4           oneof_index:1 }  oneof_decl {    name: \"foo\"  }  oneof_decl {    name: \"bar\"  }}"
            );
  return;
}

Assistant:

TEST_F(ParseMessageTest, MultipleOneofs) {
  ExpectParsesTo(
      "message TestMessage {\n"
      "  oneof foo {\n"
      "    int32 a = 1;\n"
      "    string b = 2;\n"
      "  }\n"
      "  oneof bar {\n"
      "    int32 c = 3;\n"
      "    string d = 4;\n"
      "  }\n"
      "}\n",

      "message_type {"
      "  name: \"TestMessage\""
      "  field { name:\"a\" label:LABEL_OPTIONAL type:TYPE_INT32 number:1 "
      "          oneof_index:0 }"
      "  field { name:\"b\" label:LABEL_OPTIONAL type:TYPE_STRING number:2 "
      "          oneof_index:0 }"
      "  field { name:\"c\" label:LABEL_OPTIONAL type:TYPE_INT32 number:3 "
      "          oneof_index:1 }"
      "  field { name:\"d\" label:LABEL_OPTIONAL type:TYPE_STRING number:4 "
      "          oneof_index:1 }"
      "  oneof_decl {"
      "    name: \"foo\""
      "  }"
      "  oneof_decl {"
      "    name: \"bar\""
      "  }"
      "}");
}